

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrASL0x0a(CPU *this)

{
  byte bVar1;
  
  bVar1 = this->A * '\x02';
  this->field_0x2e = this->A & 0x80 | bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0x3e;
  this->A = bVar1;
  return 2;
}

Assistant:

int CPU::instrASL0x0a() {
	A = ASL(A);
	return 2;
}